

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbinaryast.cpp
# Opt level: O0

ClassDecl * __thiscall SQASTReader::readClassDecl(SQASTReader *this)

{
  ClassDecl *this_00;
  Expr *k;
  Expr *b;
  void *in_RDI;
  void *unaff_retaddr;
  Expr *base;
  Expr *key;
  ClassDecl *klass;
  SQASTReader *in_stack_ffffffffffffffe0;
  
  this_00 = newNode<SQCompilation::ClassDecl,Arena*,decltype(nullptr),decltype(nullptr)>
                      ((SQASTReader *)key,(Arena *)base,unaff_retaddr,in_RDI);
  readTableBody((SQASTReader *)key,(TableDecl *)base);
  k = readNullableExpression(in_stack_ffffffffffffffe0);
  b = readNullableExpression(in_stack_ffffffffffffffe0);
  SQCompilation::ClassDecl::setClassKey(this_00,k);
  SQCompilation::ClassDecl::setClassBase(this_00,b);
  return this_00;
}

Assistant:

ClassDecl *SQASTReader::readClassDecl() {
  ClassDecl *klass = newNode<ClassDecl>(astArena, nullptr, nullptr);

  readTableBody(klass);

  Expr *key = readNullableExpression();
  Expr *base = readNullableExpression();

  klass->setClassKey(key);
  klass->setClassBase(base);

  return klass;
}